

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_picard_bnd.c
# Opt level: O0

void PrintOutput(N_Vector u)

{
  long lVar1;
  realtype *udata;
  realtype y;
  realtype x;
  realtype dy;
  realtype dx;
  int j;
  int i;
  N_Vector u_local;
  
  lVar1 = N_VGetArrayPointer_Serial(u);
  printf("            ");
  for (dx._4_4_ = 1; dx._4_4_ < 0x20; dx._4_4_ = dx._4_4_ + 3) {
    printf("%-8.5f ",(double)dx._4_4_ * 0.03125);
  }
  printf("\n\n");
  for (dx._0_4_ = 1; dx._0_4_ < 0x20; dx._0_4_ = dx._0_4_ + 3) {
    printf("%-8.5f    ",(double)dx._0_4_ * 0.03125);
    for (dx._4_4_ = 1; dx._4_4_ < 0x20; dx._4_4_ = dx._4_4_ + 3) {
      printf("%-8.5f ",*(undefined8 *)(lVar1 + (long)(dx._0_4_ + -1 + (dx._4_4_ + -1) * 0x1f) * 8));
    }
    printf("\n");
  }
  return;
}

Assistant:

static void PrintOutput(N_Vector u)
{
  int i, j;
  realtype dx, dy, x, y;
  realtype *udata;

  dx = ONE/(NX+1);
  dy = ONE/(NY+1);

  udata = N_VGetArrayPointer_Serial(u);

  printf("            ");
  for (i=1; i<=NX; i+= SKIP) {
    x = i*dx;
#if defined(SUNDIALS_EXTENDED_PRECISION)
      printf("%-8.5Lf ", x);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      printf("%-8.5f ", x);
#else
      printf("%-8.5f ", x);
#endif
  }
  printf("\n\n");

  for (j=1; j<=NY; j+= SKIP) {
    y = j*dy;
#if defined(SUNDIALS_EXTENDED_PRECISION)
      printf("%-8.5Lf    ", y);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      printf("%-8.5f    ", y);
#else
      printf("%-8.5f    ", y);
#endif
    for (i=1; i<=NX; i+= SKIP) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
      printf("%-8.5Lf ", IJth(udata,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
      printf("%-8.5f ", IJth(udata,i,j));
#else
      printf("%-8.5f ", IJth(udata,i,j));
#endif
    }
    printf("\n");
  }
}